

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

bool __thiscall jrtplib::RTPUDPv6Transmitter::GetLocalIPList_Interfaces(RTPUDPv6Transmitter *this)

{
  size_t *psVar1;
  short *psVar2;
  _List_node_base *p_Var3;
  long *in_RAX;
  _List_node_base *p_Var4;
  sockaddr_in6 *inaddr;
  long *plVar5;
  ifaddrs *addrs;
  long *local_28;
  
  local_28 = in_RAX;
  getifaddrs(&local_28);
  plVar5 = local_28;
  if (local_28 == (long *)0x0) {
    local_28 = (long *)0x0;
  }
  else {
    do {
      psVar2 = (short *)plVar5[3];
      if ((psVar2 != (short *)0x0) && (*psVar2 == 10)) {
        p_Var4 = (_List_node_base *)operator_new(0x20);
        p_Var3 = *(_List_node_base **)(psVar2 + 8);
        p_Var4[1]._M_next = *(_List_node_base **)(psVar2 + 4);
        p_Var4[1]._M_prev = p_Var3;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)0x0);
  }
  freeifaddrs(local_28);
  return (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&this->localIPs;
}

Assistant:

bool RTPUDPv6Transmitter::GetLocalIPList_Interfaces()
{
	struct ifaddrs *addrs,*tmp;
	
	getifaddrs(&addrs);
	tmp = addrs;
	
	while (tmp != 0)
	{
		if (tmp->ifa_addr != 0 && tmp->ifa_addr->sa_family == AF_INET6)
		{
			struct sockaddr_in6 *inaddr = (struct sockaddr_in6 *)tmp->ifa_addr;
			localIPs.push_back(inaddr->sin6_addr);
		}
		tmp = tmp->ifa_next;
	}
	
	freeifaddrs(addrs);
	
	if (localIPs.empty())
		return false;
	return true;
}